

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SySetGetNextEntry(SySet *pSet,void **ppEntry)

{
  uint uVar1;
  sxi32 sVar2;
  sxu32 sVar3;
  
  uVar1 = pSet->nCursor;
  if (uVar1 < pSet->nUsed) {
    if (ppEntry != (void **)0x0) {
      *ppEntry = (void *)((ulong)(pSet->eSize * uVar1) + (long)pSet->pBase);
    }
    sVar3 = uVar1 + 1;
    sVar2 = 0;
  }
  else {
    sVar2 = -0x12;
    sVar3 = 0;
  }
  pSet->nCursor = sVar3;
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 SySetGetNextEntry(SySet *pSet, void **ppEntry)
{
	register unsigned char *zSrc;
	if( pSet->nCursor >= pSet->nUsed ){
		/* Reset cursor */
		pSet->nCursor = 0;
		return SXERR_EOF;
	}
	zSrc = (unsigned char *)SySetBasePtr(pSet);
	if( ppEntry ){
		*ppEntry = (void *)&zSrc[pSet->nCursor * pSet->eSize];
	}
	pSet->nCursor++;
	return SXRET_OK;
}